

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  undefined1 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar3;
  char *__s;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  bool bVar7;
  Result RVar8;
  wabt *this;
  interp *this_00;
  FuncType *pFVar9;
  _func_void *p_Var10;
  Ref store;
  Callback *callback;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint uVar11;
  Store *errors_00;
  ReadBinaryOptions *options;
  string_view filename;
  string_view filename_00;
  ModuleDesc *in_stack_fffffffffffffc80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  RefPtr<wabt::interp::Module> local_358;
  RefVec imports;
  _Any_data local_318;
  code *local_308;
  code *pcStack_300;
  tuple<wabt::FileStream_*,_std::default_delete<wabt::FileStream>_> local_2f0;
  Errors errors;
  undefined1 local_2c8 [16];
  undefined3 uStack_2b8;
  undefined5 uStack_2b5;
  tuple<wabt::FileStream_*,_std::default_delete<wabt::FileStream>_> local_2b0;
  undefined4 local_2a8;
  OptionParser parser;
  Istream local_180;
  FuncType func_type;
  Ptr host_func;
  
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  _Var4 = parser.program_name_._M_dataplus;
  uVar3 = s_stdout_stream;
  parser.program_name_._M_dataplus._M_p = (pointer)0x0;
  s_stdout_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       _Var4._M_p;
  if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
      uVar3._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
    (**(code **)(*(long *)uVar3._M_t.
                          super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))();
    if (parser.program_name_._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)parser.program_name_._M_dataplus._M_p + 8))();
    }
  }
  wabt::FileStream::CreateStderr();
  _Var4 = parser.program_name_._M_dataplus;
  uVar3 = s_stderr_stream;
  parser.program_name_._M_dataplus._M_p = (pointer)0x0;
  s_stderr_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       _Var4._M_p;
  if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
      uVar3._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
    (**(code **)(*(long *)uVar3._M_t.
                          super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))();
    if (parser.program_name_._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)parser.program_name_._M_dataplus._M_p + 8))();
    }
  }
  wabt::OptionParser::OptionParser
            (&parser,"wasm-interp",
             "  read a file in the wasm binary format, and run in it a stack-based\n  interpreter.\n\nexamples:\n  # parse binary file test.wasm, and type-check it\n  $ wasm-interp test.wasm\n\n  # parse test.wasm and run all its exported functions\n  $ wasm-interp test.wasm --run-all-exports\n\n  # parse test.wasm, run the exported functions and trace the output\n  $ wasm-interp test.wasm --run-all-exports --trace\n\n  # parse test.wasm and run all its exported functions, setting the\n  # value stack size to 100 elements\n  $ wasm-interp test.wasm -V 100 --run-all-exports\n\n  # parse test.wasm, run specific exported function by name with argument\n  $ wasm-interp test.wasm -r \"func_sum\" -a \"i32:8\" -a \"i32:5\"\n"
            );
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:139:72)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:139:72)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:146:20)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:146:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'V',"value-stack-size","SIZE","Size in elements of the value stack",
             (Callback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:152:20)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:152:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'C',"call-stack-size","SIZE","Size in elements of the call stack",
             (Callback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:157:20)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:157:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption(&parser,'t',"trace","Trace execution",(NullCallback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:160:20)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:160:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'r',"run-export","FUNCTION","Run exported function by name",
             (Callback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:167:20)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:167:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'a',"argument","ARGUMENT","Add argument to an exported function execution",
             (Callback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:181:20)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:181:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"wasi",
             "Assume input module is WASI compliant (Export  WASI API the the module and invoke _start function)"
             ,(NullCallback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:185:7)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:185:7)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'e',"env","ENV","Pass the given environment string in the WASI runtime",
             (Callback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:188:7)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:188:7)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'d',"dir","DIR","Pass the given directory the the WASI runtime",
             (Callback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:192:7)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:192:7)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"run-all-exports",
             "Run all the exported functions, in order. Useful for testing",
             (NullCallback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:196:20)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:196:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"host-print",
             "Include an importable function named \"host.print\" for printing to stdout",
             (NullCallback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
  func_type.super_ExternType.kind = First;
  func_type.super_ExternType._12_4_ = 0;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:201:7)>
                ::_M_invoke;
  func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:201:7)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"dummy-import-func",
             "Provide a dummy implementation of all imported functions. The function will log the call and return an appropriate zero value."
             ,(NullCallback *)&func_type);
  if (func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start)(&func_type,&func_type,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_type,"filename",(allocator<char> *)&file_data);
  local_2c8._0_8_ = (void *)0x0;
  local_2c8._8_7_ = 0;
  local_2b0.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:204:22)>
       ::_M_invoke;
  local_2c8[0xf] = '\0';
  uStack_2b8 = 0x10fc04;
  uStack_2b5 = 0;
  wabt::OptionParser::AddArgument(&parser,(string *)&func_type,One,(Callback *)local_2c8);
  if ((code *)CONCAT53(uStack_2b5,uStack_2b8) != (code *)0x0) {
    (*(code *)CONCAT53(uStack_2b5,uStack_2b8))(local_2c8,local_2c8,3);
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_type,"arg",(allocator<char> *)&file_data);
  callback = (Callback *)local_2c8;
  local_2c8._0_8_ = (_func_int **)0x0;
  local_2c8[8] = false;
  local_2c8[9] = false;
  local_2c8[10] = false;
  local_2c8[0xb] = false;
  local_2c8[0xc] = false;
  local_2c8[0xd] = false;
  local_2c8[0xe] = false;
  local_2b0.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:207:7)>
       ::_M_invoke;
  stack0xfffffffffffffd47 = 0x10fc5400;
  uStack_2b5 = 0;
  wabt::OptionParser::AddArgument(&parser,(string *)&func_type,ZeroOrMore,callback);
  if ((code *)CONCAT53(uStack_2b5,uStack_2b8) != (code *)0x0) {
    (*(code *)CONCAT53(uStack_2b5,uStack_2b8))(local_2c8,local_2c8,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  __s = s_infile;
  uVar3 = s_stdout_stream;
  s_store.features_.exceptions_enabled_ = s_features.exceptions_enabled_;
  s_store.features_.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  s_store.features_.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  s_store.features_.sign_extension_enabled_ = s_features.sign_extension_enabled_;
  s_store.features_.simd_enabled_ = s_features.simd_enabled_;
  s_store.features_.threads_enabled_ = s_features.threads_enabled_;
  s_store.features_.function_references_enabled_ = s_features.function_references_enabled_;
  s_store.features_.multi_value_enabled_ = s_features.multi_value_enabled_;
  s_store.features_.tail_call_enabled_ = s_features.tail_call_enabled_;
  s_store.features_.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
  s_store.features_.reference_types_enabled_ = s_features.reference_types_enabled_;
  s_store.features_.annotations_enabled_ = s_features.annotations_enabled_;
  s_store.features_.code_metadata_enabled_ = s_features.code_metadata_enabled_;
  s_store.features_.gc_enabled_ = s_features.gc_enabled_;
  s_store.features_.memory64_enabled_ = s_features.memory64_enabled_;
  s_store.features_.multi_memory_enabled_ = s_features.multi_memory_enabled_;
  s_store.features_.extended_const_enabled_ = s_features.extended_const_enabled_;
  s_store.features_.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
  s_store.features_.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_358.root_index_ = 0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.obj_ = (Module *)0x0;
  local_358.store_ = (Store *)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (wabt *)strlen(s_infile);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)__s;
  RVar8 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  if (RVar8.enum_ != Error) {
    memset(&parser,0,0x120);
    local_2c8[0] = s_features.exceptions_enabled_;
    local_2c8[1] = s_features.mutable_globals_enabled_;
    local_2c8[2] = s_features.sat_float_to_int_enabled_;
    local_2c8[3] = s_features.sign_extension_enabled_;
    local_2c8[4] = s_features.simd_enabled_;
    local_2c8[5] = s_features.threads_enabled_;
    local_2c8[6] = s_features.function_references_enabled_;
    local_2c8[7] = s_features.multi_value_enabled_;
    local_2c8[8] = s_features.tail_call_enabled_;
    local_2c8[9] = s_features.bulk_memory_enabled_;
    local_2c8[10] = s_features.reference_types_enabled_;
    local_2c8[0xb] = s_features.annotations_enabled_;
    local_2c8[0xc] = s_features.code_metadata_enabled_;
    local_2c8[0xd] = s_features.gc_enabled_;
    local_2c8[0xe] = s_features.memory64_enabled_;
    stack0xfffffffffffffd47 = s_features._15_4_;
    local_2b0.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
         (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_2a8 = 0x10101;
    this_00 = (interp *)strlen(__s);
    options = (ReadBinaryOptions *)&errors;
    filename_00._M_str =
         (char *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
    filename_00._M_len = (size_t)__s;
    RVar8 = wabt::interp::ReadBinaryInterp
                      (this_00,filename_00,
                       file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish +
                       -(long)file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(size_t)local_2c8,options,
                       (Errors *)&parser,in_stack_fffffffffffffc80);
    if (RVar8.enum_ != Error) {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  (&local_180,
                   (Stream *)
                   uVar3._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
      }
      wabt::interp::ModuleDesc::ModuleDesc((ModuleDesc *)&func_type,(ModuleDesc *)&parser);
      wabt::interp::Module::New((Ptr *)&local_318,&s_store,(ModuleDesc *)&func_type);
      local_358.obj_ = (Module *)local_318._M_unused._0_8_;
      local_358.store_ = (Store *)local_318._8_8_;
      local_358.root_index_ = (Index)local_308;
      local_318._M_unused._M_object = (undefined8 *)0x0;
      local_318._8_8_ = 0;
      local_308 = (code *)0x0;
      wabt::interp::RefPtr<wabt::interp::Module>::reset((RefPtr<wabt::interp::Module> *)&local_318);
      wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)&func_type);
      wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)&parser);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (s_wasi == '\x01') {
        wabt::Stream::Writef
                  ((Stream *)
                   s_stderr_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   "wasi support not compiled in\n");
        uVar11 = 1;
      }
      else {
        local_2f0.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
        .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
             (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
             s_stdout_stream._M_t.
             super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
             super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
             super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_358.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __lhs = &((((local_358.obj_)->desc_).imports.
                   super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type).name;
        while( true ) {
          if (__lhs + -1 == pbVar2) break;
          if (*(int *)(__lhs[1]._M_dataplus._M_p + 8) == 0) {
            if (s_host_print == '\x01') {
              bVar7 = std::operator==(__lhs + -1,"host");
              if (!bVar7) goto LAB_0010f541;
              bVar7 = std::operator==(__lhs,"print");
              if (!bVar7) goto LAB_0010f541;
            }
            else {
LAB_0010f541:
              if (s_dummy_import_func != '\x01') goto LAB_0010f61d;
            }
            pFVar9 = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>
                               ((ExternType *)__lhs[1]._M_dataplus._M_p);
            wabt::interp::FuncType::FuncType(&func_type,pFVar9);
            wabt::StringPrintf_abi_cxx11_
                      ((string *)&file_data,"%s.%s",__lhs[-1]._M_dataplus._M_p,
                       (__lhs->_M_dataplus)._M_p);
            wabt::interp::FuncType::FuncType((FuncType *)local_2c8,&func_type);
            parser.program_name_._M_dataplus._M_p =
                 (pointer)local_2f0.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
            std::__cxx11::string::string
                      ((string *)&parser.program_name_._M_string_length,(string *)&file_data);
            wabt::interp::FuncType::FuncType
                      ((FuncType *)&parser.description_._M_string_length,&func_type);
            local_308 = (code *)0x0;
            pcStack_300 = (code *)0x0;
            local_318._M_unused._M_object = (void *)0x0;
            local_318._8_8_ = 0;
            p_Var10 = (_func_void *)operator_new(0x68);
            uVar5 = parser.program_name_.field_2._M_allocated_capacity;
            *(pointer *)p_Var10 = parser.program_name_._M_dataplus._M_p;
            *(_func_void **)(p_Var10 + 8) = p_Var10 + 0x18;
            puVar1 = (undefined1 *)((long)&parser.program_name_.field_2 + 8);
            if ((undefined1 *)parser.program_name_._M_string_length == puVar1) {
              *(ulong *)(p_Var10 + 0x18) =
                   CONCAT71(parser.program_name_.field_2._9_7_,
                            parser.program_name_.field_2._M_local_buf[8]);
              *(pointer *)(p_Var10 + 0x20) = parser.description_._M_dataplus._M_p;
            }
            else {
              *(size_type *)(p_Var10 + 8) = parser.program_name_._M_string_length;
              *(ulong *)(p_Var10 + 0x18) =
                   CONCAT71(parser.program_name_.field_2._9_7_,
                            parser.program_name_.field_2._M_local_buf[8]);
            }
            parser.program_name_.field_2._M_allocated_capacity = 0;
            *(undefined8 *)(p_Var10 + 0x10) = uVar5;
            parser.program_name_.field_2._M_local_buf[8] = '\0';
            parser.program_name_._M_string_length = (size_type)puVar1;
            wabt::interp::FuncType::FuncType
                      ((FuncType *)(p_Var10 + 0x28),
                       (FuncType *)&parser.description_._M_string_length);
            pcStack_300 = std::
                          _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:295:11)>
                          ::_M_invoke;
            local_308 = std::
                        _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:295:11)>
                        ::_M_manager;
            local_318._M_unused._0_8_ = (undefined8)p_Var10;
            wabt::interp::HostFunc::New
                      (&host_func,&s_store,(FuncType *)local_2c8,(Callback *)&local_318);
            if (local_308 != (code *)0x0) {
              (*local_308)(&local_318,&local_318,__destroy_functor);
            }
            BindImports(wabt::interp::RefPtr<wabt::interp::Module>const&,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>&)
            ::$_0::~__0((__0 *)&parser);
            wabt::interp::FuncType::~FuncType((FuncType *)local_2c8);
            parser.program_name_._M_dataplus._M_p =
                 (pointer)wabt::interp::RefPtr<wabt::interp::HostFunc>::ref(&host_func);
            std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
            emplace_back<wabt::interp::Ref>(&imports,(Ref *)&parser);
            wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&host_func);
            std::__cxx11::string::_M_dispose();
            wabt::interp::FuncType::~FuncType(&func_type);
          }
          else {
LAB_0010f61d:
            std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                      (&imports,(value_type *)&wabt::interp::Ref::Null);
          }
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &__lhs[2]._M_string_length;
        }
        parser.program_name_._M_dataplus._M_p = (pointer)0x0;
        parser.program_name_._M_string_length = 0;
        parser.program_name_.field_2._M_allocated_capacity = 0;
        store = wabt::interp::RefPtr<wabt::interp::Module>::ref(&local_358);
        errors_00 = &s_store;
        wabt::interp::Instance::Instantiate
                  ((Ptr *)&func_type,(Instance *)&s_store,(Store *)store.index,(Ref)&imports,
                   (RefVec *)&parser,(Ptr *)options);
        pp_Var6 = func_type.super_ExternType._vptr_ExternType;
        local_2c8._0_8_ = func_type.super_ExternType._vptr_ExternType;
        local_2c8._8_7_ = func_type.super_ExternType._8_7_;
        local_2c8[0xf] = func_type.super_ExternType._15_1_;
        uStack_2b8 = SUB83(func_type.params.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start,0);
        uStack_2b5 = (undefined5)
                     ((ulong)func_type.params.
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_start >> 0x18);
        func_type.super_ExternType._vptr_ExternType = (_func_int **)0x0;
        func_type.super_ExternType.kind = First;
        func_type.super_ExternType._12_4_ = 0;
        func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        wabt::interp::RefPtr<wabt::interp::Instance>::reset
                  ((RefPtr<wabt::interp::Instance> *)&func_type);
        if (pp_Var6 == (_func_int **)0x0) {
          wabt::interp::WriteTrap
                    ((Stream *)
                     s_stderr_stream._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                     "error initializing module",(Ptr *)&parser);
          wabt::interp::RefPtr<wabt::interp::Trap>::reset((RefPtr<wabt::interp::Trap> *)&parser);
        }
        else {
          wabt::interp::RefPtr<wabt::interp::Trap>::reset((RefPtr<wabt::interp::Trap> *)&parser);
          if (s_run_all_exports == '\x01') {
            RunAllExports((Ptr *)local_2c8,(Errors *)errors_00);
          }
          if (s_run_exports.super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>._M_impl.
              super__Vector_impl_data._M_start !=
              s_run_exports.super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            RunSpecificExports((Ptr *)local_2c8,(Errors *)errors_00,&s_run_exports);
          }
        }
        uVar11 = (uint)(pp_Var6 == (_func_int **)0x0);
        wabt::interp::RefPtr<wabt::interp::Instance>::reset
                  ((RefPtr<wabt::interp::Instance> *)local_2c8);
      }
      std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
                (&imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)
      ;
      goto LAB_0010f831;
    }
    wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)&parser);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  parser.program_name_._M_dataplus._M_p = (pointer)&parser.program_name_.field_2;
  parser.program_name_._M_string_length = 0;
  parser.program_name_.field_2._M_allocated_capacity =
       parser.program_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
  uVar11 = 1;
  wabt::FormatErrorsToFile
            (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,&parser.program_name_,Never,0x50);
  std::__cxx11::string::_M_dispose();
LAB_0010f831:
  wabt::interp::RefPtr<wabt::interp::Module>::reset(&local_358);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  return uVar11;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();
  s_stderr_stream = FileStream::CreateStderr();

  ParseOptions(argc, argv);
  s_store.setFeatures(s_features);

  wabt::Result result = ReadAndRunModule(s_infile);
  return result != wabt::Result::Ok;
}